

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3159ba::Handlers::beginDict
          (Handlers *this,json_handler_t *start_fn,bare_handler_t *end_fn)

{
  JSONHandler *this_00;
  function<void_()> local_b0;
  void_handler_t local_90;
  function<void_(JSON)> local_60;
  json_handler_t local_40;
  bare_handler_t *local_20;
  bare_handler_t *end_fn_local;
  json_handler_t *start_fn_local;
  Handlers *this_local;
  
  this_00 = this->jh;
  local_20 = end_fn;
  end_fn_local = (bare_handler_t *)start_fn;
  start_fn_local = (json_handler_t *)this;
  std::function<void_(JSON)>::function(&local_60,start_fn);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<(anonymous_namespace)::Handlers::beginDict(std::function<void(JSON)>,std::function<void()>)::__0,void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_40,
             (anon_class_32_1_3668df43 *)&local_60);
  std::function<void_()>::function(&local_b0,end_fn);
  std::function<void(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::Handlers::beginDict(std::function<void(JSON)>,std::function<void()>)::__1,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_90,
             (anon_class_32_1_53ba67ea *)&local_b0);
  JSONHandler::addDictHandlers(this_00,&local_40,&local_90);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  (anonymous_namespace)::Handlers::beginDict(std::function<void(JSON)>,std::function<void()>)::$_1::
  ~__1((__1 *)&local_b0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_40);
  (anonymous_namespace)::Handlers::beginDict(std::function<void(JSON)>,std::function<void()>)::$_0::
  ~__0((__0 *)&local_60);
  return;
}

Assistant:

void
Handlers::beginDict(json_handler_t start_fn, bare_handler_t end_fn)
{
    jh->addDictHandlers(
        [start_fn](std::string const&, JSON j) { start_fn(j); },
        [end_fn](std::string const&) { end_fn(); });
}